

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_sniffer.cpp
# Opt level: O2

SnifferResult * __thiscall
duckdb::CSVSniffer::AdaptiveSniff
          (SnifferResult *__return_storage_ptr__,CSVSniffer *this,CSVSchema *file_schema)

{
  vector<duckdb::LogicalType,_true> *pvVar1;
  bool bVar2;
  bool bVar3;
  CSVErrorHandler *pCVar4;
  InvalidInputException *this_00;
  string error;
  AdaptiveSnifferResult min_sniff_res;
  
  MinimalSniff(&min_sniff_res,this);
  pCVar4 = shared_ptr<duckdb::CSVErrorHandler,_true>::operator->(&this->error_handler);
  bVar2 = CSVErrorHandler::AnyErrors(pCVar4);
  bVar3 = true;
  if (!bVar2) {
    pCVar4 = shared_ptr<duckdb::CSVErrorHandler,_true>::operator->(&this->detection_error_handler);
    bVar3 = CSVErrorHandler::AnyErrors(pCVar4);
  }
  pCVar4 = shared_ptr<duckdb::CSVErrorHandler,_true>::operator->(&this->error_handler);
  bVar2 = CSVErrorHandler::AnyErrors(pCVar4);
  if (bVar2) {
LAB_0097f0a4:
    if (bVar3 == false) {
LAB_0097f17f:
      AdaptiveSnifferResult::ToSnifferResult(__return_storage_ptr__,&min_sniff_res);
      goto LAB_0097f18c;
    }
  }
  else {
    pCVar4 = shared_ptr<duckdb::CSVErrorHandler,_true>::operator->(&this->detection_error_handler);
    bVar2 = CSVErrorHandler::AnyErrors(pCVar4);
    if ((bVar2) ||
       ((pvVar1 = (this->set_columns).types, pvVar1 != (vector<duckdb::LogicalType,_true> *)0x0 &&
        ((pvVar1->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
         super__Vector_impl_data._M_start !=
         (pvVar1->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
         super__Vector_impl_data._M_finish)))) goto LAB_0097f0a4;
    bVar2 = MultiFileOptions::AnySet(this->file_options);
    if (bVar2) goto LAB_0097f0a4;
    error._M_dataplus._M_p = (pointer)&error.field_2;
    error._M_string_length = 0;
    error.field_2._M_local_buf[0] = '\0';
    bVar2 = CSVSchema::SchemasMatch
                      (file_schema,&error,&min_sniff_res.super_SnifferResult,
                       &this->options->file_path,true);
    ::std::__cxx11::string::~string((string *)&error);
    if (bVar2) goto LAB_0097f17f;
  }
  SniffCSV(__return_storage_ptr__,this,false);
  pvVar1 = (this->set_columns).types;
  if ((pvVar1 == (vector<duckdb::LogicalType,_true> *)0x0) ||
     ((pvVar1->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (pvVar1->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    bVar2 = MultiFileOptions::AnySet(this->file_options);
    if (!bVar2) {
      error._M_dataplus._M_p = (pointer)&error.field_2;
      error._M_string_length = 0;
      error.field_2._M_local_buf[0] = '\0';
      bVar2 = CSVSchema::SchemasMatch
                        (file_schema,&error,__return_storage_ptr__,&this->options->file_path,false);
      if ((!bVar2) && ((this->options->ignore_errors).value == false)) {
        this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        InvalidInputException::InvalidInputException(this_00,&error);
        __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      ::std::__cxx11::string::~string((string *)&error);
    }
  }
LAB_0097f18c:
  SnifferResult::~SnifferResult(&min_sniff_res.super_SnifferResult);
  return __return_storage_ptr__;
}

Assistant:

SnifferResult CSVSniffer::AdaptiveSniff(const CSVSchema &file_schema) {
	auto min_sniff_res = MinimalSniff();
	bool run_full = error_handler->AnyErrors() || detection_error_handler->AnyErrors();
	// Check if we are happy with the result or if we need to do more sniffing
	if (!error_handler->AnyErrors() && !detection_error_handler->AnyErrors()) {
		// If we got no errors, we also run full if schemas do not match.
		if (!set_columns.IsSet() && !file_options.AnySet()) {
			string error;
			run_full = !file_schema.SchemasMatch(error, min_sniff_res, options.file_path, true);
		}
	}
	if (run_full) {
		// We run full sniffer
		auto full_sniffer = SniffCSV();
		if (!set_columns.IsSet() && !file_options.AnySet()) {
			string error;
			if (!file_schema.SchemasMatch(error, full_sniffer, options.file_path, false) &&
			    !options.ignore_errors.GetValue()) {
				throw InvalidInputException(error);
			}
		}
		return full_sniffer;
	}
	return min_sniff_res.ToSnifferResult();
}